

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.h
# Opt level: O0

void __thiscall
VectorFormatter<DefaultFormatter>::Ser<DataStream,std::vector<uint256,std::allocator<uint256>>>
          (VectorFormatter<DefaultFormatter> *this,DataStream *s,
          vector<uint256,_std::allocator<uint256>_> *v)

{
  long lVar1;
  bool bVar2;
  vector<uint256,_std::allocator<uint256>_> *in_RSI;
  long in_FS_OFFSET;
  value_type *elem;
  vector<uint256,_std::allocator<uint256>_> *__range2;
  DefaultFormatter formatter;
  const_iterator __end0;
  const_iterator __begin0;
  DataStream *in_stack_ffffffffffffffa8;
  DataStream *in_stack_ffffffffffffffb8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  std::vector<uint256,_std::allocator<uint256>_>::size
            ((vector<uint256,_std::allocator<uint256>_> *)in_stack_ffffffffffffffa8);
  WriteCompactSize<DataStream>(in_stack_ffffffffffffffb8,(uint64_t)in_RSI);
  std::vector<uint256,_std::allocator<uint256>_>::begin(in_RSI);
  std::vector<uint256,_std::allocator<uint256>_>::end(in_RSI);
  while( true ) {
    bVar2 = __gnu_cxx::operator==<const_uint256_*,_std::vector<uint256,_std::allocator<uint256>_>_>
                      ((__normal_iterator<const_uint256_*,_std::vector<uint256,_std::allocator<uint256>_>_>
                        *)in_stack_ffffffffffffffb8,
                       (__normal_iterator<const_uint256_*,_std::vector<uint256,_std::allocator<uint256>_>_>
                        *)in_RSI);
    if (((bVar2 ^ 0xffU) & 1) == 0) break;
    in_stack_ffffffffffffffb8 =
         (DataStream *)
         __gnu_cxx::
         __normal_iterator<const_uint256_*,_std::vector<uint256,_std::allocator<uint256>_>_>::
         operator*((__normal_iterator<const_uint256_*,_std::vector<uint256,_std::allocator<uint256>_>_>
                    *)in_stack_ffffffffffffffa8);
    DefaultFormatter::Ser<DataStream,uint256>(in_stack_ffffffffffffffa8,(uint256 *)0x31d5d3);
    __gnu_cxx::__normal_iterator<const_uint256_*,_std::vector<uint256,_std::allocator<uint256>_>_>::
    operator++((__normal_iterator<const_uint256_*,_std::vector<uint256,_std::allocator<uint256>_>_>
                *)in_stack_ffffffffffffffa8);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Ser(Stream& s, const V& v)
    {
        Formatter formatter;
        WriteCompactSize(s, v.size());
        for (const typename V::value_type& elem : v) {
            formatter.Ser(s, elem);
        }
    }